

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNRand.cpp
# Opt level: O3

void __thiscall NaPNRandomGen::set_uniform_distrib(NaPNRandomGen *this,NaReal *fMin,NaReal *fMax)

{
  NaUnit *pNVar1;
  int iVar2;
  uint uVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  NaPetriNode::check_tunable((NaPetriNode *)this);
  if (((fMax != (NaReal *)0x0) && (fMin != (NaReal *)0x0)) &&
     (pNVar1 = (this->super_NaPNGenerator).pUnit, pNVar1 != (NaUnit *)0x0)) {
    iVar2 = (*(pNVar1->super_NaLogging)._vptr_NaLogging[9])();
    if (iVar2 != 0) {
      uVar5 = 0;
      do {
        NaRandomSequence::SetDistribution(this->pRandGen,rdUniform,(uint)uVar5);
        NaRandomSequence::SetUniformParams(this->pRandGen,fMin[uVar5],fMax[uVar5],(uint)uVar5);
        uVar5 = uVar5 + 1;
        uVar3 = (*(((this->super_NaPNGenerator).pUnit)->super_NaLogging)._vptr_NaLogging[9])();
      } while (uVar5 < uVar3);
    }
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

void
NaPNRandomGen::set_uniform_distrib (const NaReal* fMin, const NaReal* fMax)
{
  check_tunable();

  if(NULL == pUnit || NULL == fMin || NULL == fMax)
    throw(na_null_pointer);

  // Setup distribution parameters
  for(unsigned i = 0; i < pUnit->InputDim(); ++i)
    {
      pRandGen->SetDistribution(rdUniform, i);
      pRandGen->SetUniformParams(fMin[i], fMax[i], i);
    }
}